

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-homedir.c
# Opt level: O2

int run_test_homedir(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  int64_t eval_b;
  int64_t eval_a;
  size_t len;
  char homedir [4096];
  
  len = 0x1000;
  homedir[0] = '\0';
  eval_a = strlen(homedir);
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_os_homedir(homedir,&len);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      eval_a = strlen(homedir);
      eval_b = len;
      if (eval_a == len) {
        eval_a = len;
        eval_b = 0;
        if ((long)len < 1) {
          pcVar3 = ">";
          pcVar4 = "0";
          pcVar2 = "len";
          uVar5 = 0x29;
        }
        else {
          eval_a = (int64_t)homedir[len];
          eval_b = 0;
          if (eval_a == 0) {
            if (len == 1) {
              eval_a = (int64_t)homedir[0];
              eval_b = 0x2f;
              if (eval_a != 0x2f) {
                pcVar3 = "==";
                pcVar4 = "\'/\'";
                pcVar2 = "homedir[0]";
                uVar5 = 0x33;
                goto LAB_0014589b;
              }
            }
            else {
              eval_b = 0x2f;
              if (homedir[len - 1] == '/') {
                pcVar3 = "!=";
                pcVar4 = "\'/\'";
                pcVar2 = "homedir[len - 1]";
                uVar5 = 0x35;
                eval_a = 0x2f;
                goto LAB_0014589b;
              }
            }
            len = 1;
            iVar1 = uv_os_homedir(homedir);
            eval_a = (int64_t)iVar1;
            eval_b = -0x69;
            if (eval_a == -0x69) {
              eval_a = len;
              eval_b = 1;
              if ((long)len < 2) {
                pcVar3 = ">";
                pcVar4 = "1";
                pcVar2 = "len";
                uVar5 = 0x3c;
              }
              else {
                iVar1 = uv_os_homedir(0,&len);
                eval_a = (int64_t)iVar1;
                eval_b = -0x16;
                if (eval_a == -0x16) {
                  iVar1 = uv_os_homedir(homedir,0);
                  eval_a = (int64_t)iVar1;
                  eval_b = -0x16;
                  if (eval_a == -0x16) {
                    len = 0;
                    iVar1 = uv_os_homedir(homedir);
                    eval_a = (int64_t)iVar1;
                    eval_b = -0x16;
                    if (eval_a == -0x16) {
                      return 0;
                    }
                    pcVar3 = "==";
                    pcVar4 = "UV_EINVAL";
                    pcVar2 = "r";
                    uVar5 = 0x45;
                  }
                  else {
                    pcVar3 = "==";
                    pcVar4 = "UV_EINVAL";
                    pcVar2 = "r";
                    uVar5 = 0x42;
                  }
                }
                else {
                  pcVar3 = "==";
                  pcVar4 = "UV_EINVAL";
                  pcVar2 = "r";
                  uVar5 = 0x40;
                }
              }
            }
            else {
              pcVar3 = "==";
              pcVar4 = "UV_ENOBUFS";
              pcVar2 = "r";
              uVar5 = 0x3b;
            }
          }
          else {
            pcVar3 = "==";
            pcVar4 = "\'\\0\'";
            pcVar2 = "homedir[len]";
            uVar5 = 0x2a;
          }
        }
      }
      else {
        pcVar3 = "==";
        pcVar4 = "len";
        pcVar2 = "strlen(homedir)";
        uVar5 = 0x28;
      }
    }
    else {
      pcVar3 = "==";
      pcVar4 = "0";
      pcVar2 = "r";
      uVar5 = 0x27;
    }
  }
  else {
    pcVar3 = "==";
    pcVar4 = "0";
    pcVar2 = "strlen(homedir)";
    uVar5 = 0x25;
  }
LAB_0014589b:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-homedir.c"
          ,uVar5,pcVar2,pcVar3,pcVar4,eval_a,pcVar3,eval_b);
  abort();
}

Assistant:

TEST_IMPL(homedir) {
  char homedir[PATHMAX];
  size_t len;
  int r;

  /* Test the normal case */
  len = sizeof homedir;
  homedir[0] = '\0';
  ASSERT_OK(strlen(homedir));
  r = uv_os_homedir(homedir, &len);
  ASSERT_OK(r);
  ASSERT_EQ(strlen(homedir), len);
  ASSERT_GT(len, 0);
  ASSERT_EQ(homedir[len], '\0');

#ifdef _WIN32
  if (len == 3 && homedir[1] == ':')
    ASSERT_EQ(homedir[2], '\\');
  else
    ASSERT_NE(homedir[len - 1], '\\');
#else
  if (len == 1)
    ASSERT_EQ(homedir[0], '/');
  else
    ASSERT_NE(homedir[len - 1], '/');
#endif

  /* Test the case where the buffer is too small */
  len = SMALLPATH;
  r = uv_os_homedir(homedir, &len);
  ASSERT_EQ(r, UV_ENOBUFS);
  ASSERT_GT(len, SMALLPATH);

  /* Test invalid inputs */
  r = uv_os_homedir(NULL, &len);
  ASSERT_EQ(r, UV_EINVAL);
  r = uv_os_homedir(homedir, NULL);
  ASSERT_EQ(r, UV_EINVAL);
  len = 0;
  r = uv_os_homedir(homedir, &len);
  ASSERT_EQ(r, UV_EINVAL);

  return 0;
}